

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_cls_s32_arm(uint32_t x)

{
  undefined4 local_10;
  undefined4 local_c;
  int count;
  uint32_t x_local;
  
  local_c = x;
  if ((int)x < 0) {
    local_c = x ^ 0xffffffff;
  }
  local_10 = 0x20;
  for (; local_c != 0; local_c = local_c >> 1) {
    local_10 = local_10 + -1;
  }
  return local_10 - 1;
}

Assistant:

uint32_t HELPER(neon_cls_s32)(uint32_t x)
{
    int count;
    if ((int32_t)x < 0)
        x = ~x;
    for (count = 32; x; count--)
        x = x >> 1;
    return count - 1;
}